

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

void __thiscall QSplitterPrivate::storeSizes(QSplitterPrivate *this)

{
  QSplitterLayoutStruct *this_00;
  Representation RVar1;
  QSize QVar2;
  int i;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < (ulong)(this->list).d.size; uVar3 = uVar3 + 1) {
    this_00 = (this->list).d.ptr[uVar3];
    QVar2 = QRect::size(&this_00->rect);
    RVar1 = QVar2.ht.m_i;
    if (this->orient == Horizontal) {
      RVar1 = QVar2.wd.m_i;
    }
    this_00->sizer = RVar1.m_i;
  }
  return;
}

Assistant:

void QSplitterPrivate::storeSizes()
{
    for (int i = 0; i < list.size(); ++i) {
        QSplitterLayoutStruct *sls = list.at(i);
        sls->sizer = pick(sls->rect.size());
    }
}